

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

VP8LDecoder * VP8LNew(void)

{
  VP8LDecoder *pVVar1;
  
  pVVar1 = (VP8LDecoder *)WebPSafeCalloc(1,400);
  if (pVVar1 == (VP8LDecoder *)0x0) {
    pVVar1 = (VP8LDecoder *)0x0;
  }
  else {
    pVVar1->status_ = VP8_STATUS_OK;
    pVVar1->state_ = READ_DIM;
    VP8LDspInit();
  }
  return pVVar1;
}

Assistant:

VP8LDecoder* VP8LNew(void) {
  VP8LDecoder* const dec = (VP8LDecoder*)WebPSafeCalloc(1ULL, sizeof(*dec));
  if (dec == NULL) return NULL;
  dec->status_ = VP8_STATUS_OK;
  dec->state_ = READ_DIM;

  VP8LDspInit();  // Init critical function pointers.

  return dec;
}